

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

bool __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::
FindHeapObjectImpl<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress,
          Recycler *recycler,FindHeapObjectFlags flags,RecyclerHeapObjectInfo *heapObject)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  SmallHeapBlockBitVector *this_00;
  byte local_7a;
  byte local_79;
  RecyclerHeapObjectInfo local_70;
  byte *local_48;
  byte *attributes;
  bool disableCheck;
  RecyclerHeapObjectInfo *pRStack_38;
  ushort index;
  RecyclerHeapObjectInfo *heapObject_local;
  Recycler *pRStack_28;
  FindHeapObjectFlags flags_local;
  Recycler *recycler_local;
  void *objectAddress_local;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  pRStack_38 = heapObject;
  heapObject_local._4_4_ = flags;
  pRStack_28 = recycler;
  recycler_local = (Recycler *)objectAddress;
  objectAddress_local = this;
  if (((flags & FindHeapObjectFlags_AllowInterior) == FindHeapObjectFlags_NoFlags) ||
     (recycler_local = (Recycler *)GetRealAddressFromInterior(this,objectAddress),
     recycler_local != (Recycler *)0x0)) {
    attributes._6_2_ = GetAddressIndex(this,recycler_local);
    if (attributes._6_2_ == 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x272,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                         "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (attributes._6_2_ == 0xffff) {
      this_local._7_1_ = false;
    }
    else {
      local_79 = 1;
      if ((heapObject_local._4_4_ & FindHeapObjectFlags_NoFreeBitVerify) ==
          FindHeapObjectFlags_NoFlags) {
        local_7a = 0;
        if ((heapObject_local._4_4_ & FindHeapObjectFlags_VerifyFreeBitForAttribute) !=
            FindHeapObjectFlags_NoFlags) {
          bVar2 = HasPendingDisposeObjects(this);
          local_7a = bVar2 ^ 0xff;
        }
        local_79 = local_7a;
      }
      attributes._5_1_ = local_79 & 1;
      if ((attributes._5_1_ == 0) &&
         (BVar5 = Recycler::IsConcurrentSweepExecutingState(pRStack_28), BVar5 == 0)) {
        if ((heapObject_local._4_4_ & FindHeapObjectFlags_ClearedAllocators) ==
            FindHeapObjectFlags_NoFlags) {
          bVar2 = IsInAllocator(this);
          if (bVar2) {
            HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
            UpdateAllocators((HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>
                              *)this->heapBucket);
          }
        }
        else {
          bVar2 = HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
                  AllocatorsAreEmpty((HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>
                                      *)this->heapBucket);
          if ((!bVar2) && ((pRStack_28->isHeapEnumInProgress & 1U) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                               ,0x28d,
                               "(((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress)"
                               ,
                               "((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
        }
        this_00 = EnsureFreeBitVector(this,true);
        uVar4 = GetObjectBitDelta(this);
        BVar3 = BVStatic<256UL>::Test(this_00,(uint)uVar4 * (uint)attributes._6_2_);
        if (BVar3 != '\0') {
          return false;
        }
      }
      local_48 = ObjectInfo(this,(uint)attributes._6_2_);
      RecyclerHeapObjectInfo::RecyclerHeapObjectInfo
                (&local_70,recycler_local,pRStack_28,&this->super_HeapBlock,local_48);
      memcpy(pRStack_38,&local_70,0x21);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
SmallHeapBlockT<TBlockAttributes>::FindHeapObjectImpl(void* objectAddress, Recycler * recycler, FindHeapObjectFlags flags, RecyclerHeapObjectInfo& heapObject)
{
    if (flags & FindHeapObjectFlags_AllowInterior)
    {
        objectAddress = (void*) this->GetRealAddressFromInterior(objectAddress);
        if (objectAddress == nullptr)
        {
            return false;
        }
    }

    ushort index = GetAddressIndex(objectAddress);
    Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

    if (index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return false;
    }

    // If we have pending object, we still need to check the free bit if the caller requested the attribute to be correct
    bool const disableCheck = ((flags & FindHeapObjectFlags_NoFreeBitVerify) != 0) ||
        ((flags & FindHeapObjectFlags_VerifyFreeBitForAttribute) != 0 && !this->HasPendingDisposeObjects());
    if (!disableCheck)
    {
        // REVIEW: Checking if an object if free is strictly not necessary
        // In all case, we should have a valid object, For memory protect heap, this is just to make sure we don't
        // free pointers that are invalid.
#if ENABLE_CONCURRENT_GC
        if (recycler->IsConcurrentSweepExecutingState())
        {
            // TODO: unless we know the state of the heap block, we don't know.
            // skip the check for now.
        }
        else
#endif
        {
            if (flags & FindHeapObjectFlags_ClearedAllocators)
            {
                // Heap enum has some case where it allocates, so we can't assert
                Assert(((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress);
            }
            else if (this->IsInAllocator())
            {
                ((HeapBucketT<TBlockType> *)this->heapBucket)->UpdateAllocators();
            }

            // REVIEW allocation heuristics
            if (this->EnsureFreeBitVector()->Test(this->GetObjectBitDelta() * index))
            {
                return false;
            }
        }
    }

    byte& attributes = ObjectInfo(index);
    heapObject = RecyclerHeapObjectInfo(objectAddress, recycler, this, &attributes);
    return true;
}